

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathQuat.h
# Opt level: O0

float Imath_2_5::angle4D<float>(Quat<float> *q1,Quat<float> *q2)

{
  Quat<float> *in_RSI;
  Quat<float> *in_RDI;
  float fVar1;
  undefined4 extraout_XMM0_Db;
  double dVar2;
  undefined4 extraout_XMM0_Db_00;
  double dVar3;
  float lengthS;
  Quat<float> s;
  float lengthD;
  Quat<float> d;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  Quat<float> *in_stack_ffffffffffffffd0;
  
  operator-(in_RDI,in_RSI);
  fVar1 = operator^(in_stack_ffffffffffffffd0,
                    (Quat<float> *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  dVar2 = Math<float>::sqrt((double)CONCAT44(extraout_XMM0_Db,fVar1));
  operator+(in_RDI,in_RSI);
  fVar1 = operator^(in_stack_ffffffffffffffd0,
                    (Quat<float> *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  dVar3 = Math<float>::sqrt((double)CONCAT44(extraout_XMM0_Db_00,fVar1));
  dVar2 = Math<float>::atan2((double)((ulong)dVar2 & 0xffffffff),(double)((ulong)dVar3 & 0xffffffff)
                            );
  return SUB84(dVar2,0) * 2.0;
}

Assistant:

T
angle4D (const Quat<T> &q1, const Quat<T> &q2)
{
    //
    // Compute the angle between two quaternions,
    // interpreting the quaternions as 4D vectors.
    //

    Quat<T> d = q1 - q2;
    T lengthD = Math<T>::sqrt (d ^ d);

    Quat<T> s = q1 + q2;
    T lengthS = Math<T>::sqrt (s ^ s);

    return 2 * Math<T>::atan2 (lengthD, lengthS);
}